

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::
initialize<std::pair<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>(*&)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>),std::pair<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
          (cpp_function *this,
          _func_pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>
          **f,_func_pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>
              *param_2,name *extra,scope *extra_1,sibling *extra_2,arg *extra_3,arg *extra_4,
          arg *extra_5,arg *extra_6)

{
  function_record *rec;
  
  rec = make_function_record(this);
  rec->data[0] = *f;
  rec->impl = initialize<std::pair<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>(*&)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>),std::pair<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>(std::pair<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>(*&)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>),std::pair<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>(*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,pybind11::arg_const&,pybind11::arg_const&,pybind11::arg_const&)
              ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  detail::
  process_attributes<pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg>
  ::init((EVP_PKEY_CTX *)extra);
  initialize_generic(this,rec,initialize<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_(*&)(Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>),_std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg>
                              ::signature.text,
                     initialize<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_(*&)(Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>),_std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg>
                     ::types._M_elems,4);
  rec->field_0x59 = rec->field_0x59 | 4;
  rec->data[1] = &(*)(Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>)
                  ::typeinfo;
  return;
}

Assistant:

void initialize(Func &&f, Return (*)(Args...), const Extra&... extra) {
        using namespace detail;
        struct capture { remove_reference_t<Func> f; };

        /* Store the function including any extra state it might have (e.g. a lambda capture object) */
        auto rec = make_function_record();

        /* Store the capture object directly in the function record if there is enough space */
        if (sizeof(capture) <= sizeof(rec->data)) {
            /* Without these pragmas, GCC warns that there might not be
               enough space to use the placement new operator. However, the
               'if' statement above ensures that this is the case. */
#if defined(__GNUG__) && !defined(__clang__) && __GNUC__ >= 6
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wplacement-new"
#endif
            new ((capture *) &rec->data) capture { std::forward<Func>(f) };
#if defined(__GNUG__) && !defined(__clang__) && __GNUC__ >= 6
#  pragma GCC diagnostic pop
#endif
            if (!std::is_trivially_destructible<Func>::value)
                rec->free_data = [](function_record *r) { ((capture *) &r->data)->~capture(); };
        } else {
            rec->data[0] = new capture { std::forward<Func>(f) };
            rec->free_data = [](function_record *r) { delete ((capture *) r->data[0]); };
        }

        /* Type casters for the function arguments and return value */
        using cast_in = argument_loader<Args...>;
        using cast_out = make_caster<
            conditional_t<std::is_void<Return>::value, void_type, Return>
        >;

        static_assert(expected_num_args<Extra...>(sizeof...(Args), cast_in::has_args, cast_in::has_kwargs),
                      "The number of argument annotations does not match the number of function arguments");

        /* Dispatch code which converts function arguments and performs the actual function call */
        rec->impl = [](function_call &call) -> handle {
            cast_in args_converter;

            /* Try to cast the function arguments into the C++ domain */
            if (!args_converter.load_args(call))
                return PYBIND11_TRY_NEXT_OVERLOAD;

            /* Invoke call policy pre-call hook */
            process_attributes<Extra...>::precall(call);

            /* Get a pointer to the capture object */
            auto data = (sizeof(capture) <= sizeof(call.func.data)
                         ? &call.func.data : call.func.data[0]);
            capture *cap = const_cast<capture *>(reinterpret_cast<const capture *>(data));

            /* Override policy for rvalues -- usually to enforce rvp::move on an rvalue */
            return_value_policy policy = return_value_policy_override<Return>::policy(call.func.policy);

            /* Function scope guard -- defaults to the compile-to-nothing `void_type` */
            using Guard = extract_guard_t<Extra...>;

            /* Perform the function call */
            handle result = cast_out::cast(
                std::move(args_converter).template call<Return, Guard>(cap->f), policy, call.parent);

            /* Invoke call policy post-call hook */
            process_attributes<Extra...>::postcall(call, result);

            return result;
        };

        /* Process any user-provided function attributes */
        process_attributes<Extra...>::init(extra..., rec);

        /* Generate a readable signature describing the function's arguments and return value types */
        static constexpr auto signature = _("(") + cast_in::arg_names + _(") -> ") + cast_out::name;
        PYBIND11_DESCR_CONSTEXPR auto types = decltype(signature)::types();

        /* Register the function with Python from generic (non-templated) code */
        initialize_generic(rec, signature.text, types.data(), sizeof...(Args));

        if (cast_in::has_args) rec->has_args = true;
        if (cast_in::has_kwargs) rec->has_kwargs = true;

        /* Stash some additional information used by an important optimization in 'functional.h' */
        using FunctionType = Return (*)(Args...);
        constexpr bool is_function_ptr =
            std::is_convertible<Func, FunctionType>::value &&
            sizeof(capture) == sizeof(void *);
        if (is_function_ptr) {
            rec->is_stateless = true;
            rec->data[1] = const_cast<void *>(reinterpret_cast<const void *>(&typeid(FunctionType)));
        }
    }